

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

void cuddLocalCacheClearDead(DdManager *manager)

{
  DdNode **ppDVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  DdLocalCache *pDVar5;
  DdLocalCacheItem *pDVar6;
  DdLocalCache **ppDVar7;
  uint uVar8;
  ulong uVar9;
  
  ppDVar7 = &manager->localCaches;
  do {
    pDVar5 = *ppDVar7;
    if (pDVar5 == (DdLocalCache *)0x0) {
      return;
    }
    uVar2 = pDVar5->keysize;
    uVar3 = pDVar5->itemsize;
    uVar4 = pDVar5->slots;
    pDVar6 = pDVar5->item;
    for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
      if (pDVar6->value != (DdNode *)0x0) {
        if (*(int *)(((ulong)pDVar6->value & 0xfffffffffffffffe) + 4) != 0) {
          uVar9 = 0;
          do {
            if (uVar2 == uVar9) goto LAB_0061d156;
            ppDVar1 = pDVar6->key + uVar9;
            uVar9 = uVar9 + 1;
          } while (*(int *)(((ulong)*ppDVar1 & 0xfffffffffffffffe) + 4) != 0);
        }
        pDVar6->value = (DdNode *)0x0;
      }
LAB_0061d156:
      pDVar6 = (DdLocalCacheItem *)((long)pDVar6->key + ((ulong)uVar3 - 8));
    }
    ppDVar7 = &pDVar5->next;
  } while( true );
}

Assistant:

void
cuddLocalCacheClearDead(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;
    unsigned int keysize;
    unsigned int itemsize;
    unsigned int slots;
    DdLocalCacheItem *item;
    DdNodePtr *key;
    unsigned int i, j;

    while (cache != NULL) {
        keysize = cache->keysize;
        itemsize = cache->itemsize;
        slots = cache->slots;
        item = cache->item;
        for (i = 0; i < slots; i++) {
            if (item->value != NULL) {
                if (Cudd_Regular(item->value)->ref == 0) {
                    item->value = NULL;
                } else {
                    key = item->key;
                    for (j = 0; j < keysize; j++) {
                        if (Cudd_Regular(key[j])->ref == 0) {
                            item->value = NULL;
                            break;
                        }
                    }
                }
            }
            item = (DdLocalCacheItem *) ((char *) item + itemsize);
        }
        cache = cache->next;
    }
    return;

}